

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O3

bool jessilib::hex_shrink_sequence_action<char8_t,2ul,true,false>
               (char8_t **in_write_head,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> *read_view)

{
  size_t sVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  
  sVar1 = read_view->_M_len;
  if (sVar1 != 0) {
    lVar3 = (ulong)(sVar1 != 1) + 1;
    bVar6 = 0;
    lVar4 = 0;
    do {
      lVar7 = (long)read_view->_M_str[lVar4];
      lVar5 = lVar4;
      if ((lVar7 < 0) || (0xf < (byte)(&base_table)[lVar7])) break;
      bVar6 = (&base_table)[lVar7] | bVar6 << 4;
      lVar4 = lVar4 + 1;
      lVar5 = lVar3;
    } while (lVar3 != lVar4);
    if (lVar5 == 2) {
      read_view->_M_str = read_view->_M_str + 2;
      read_view->_M_len = sVar1 - 2;
      pbVar2 = (byte *)*in_write_head;
      *pbVar2 = bVar6;
      *in_write_head = (char8_t *)(pbVar2 + 1);
      return true;
    }
  }
  return false;
}

Assistant:

constexpr bool hex_shrink_sequence_action(CharT*& in_write_head, std::basic_string_view<CharT>& read_view) {
	// Does not modify
	auto read_hex = [](uint32_t& out_value, std::basic_string_view<CharT> in_view, size_t max_digits) constexpr {
		size_t result{};
		int hex_value;
		out_value = 0;
		while (result != max_digits
			&& !in_view.empty()) {
			hex_value = as_base(in_view.front(), 16); // hexadecimal characters are always 1 unit
			if (hex_value < 0) {
				// Not a hexadecimal character; push what we have and handle this
				return result;
			}

			out_value <<= 4;
			out_value |= hex_value;

			in_view.remove_prefix(1);
			++result;
		}

		// Number of elements that are hexadecimal digits
		return result;
	};

	// Read in hex value
	uint32_t hex_value;
	size_t units_read = read_hex(hex_value, read_view, MaxDigitsV);

	// Sanity check digits read
	if constexpr(ExactDigitsV) {
		if (units_read != MaxDigitsV) {
			// We expected example MaxDigitsV digits; fail
			return false;
		}
	}
	else {
		if (units_read == 0) {
			// We didn't read any digits; fail
			return false;
		}
	}

	// We read an acceptable number of digits; write the unit and call it a day
	read_view.remove_prefix(units_read);
	if constexpr (IsUnicode) {
		in_write_head += encode_codepoint(in_write_head, hex_value);
	}
	else {
		static_assert(MaxDigitsV <= sizeof(CharT) * 2);
		*in_write_head = static_cast<CharT>(hex_value);
		++in_write_head;
	}

	return true;
}